

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawSpanMaskedAddClampPalCommand::Execute
          (DrawSpanMaskedAddClampPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  dsfixed_t dVar2;
  dsfixed_t dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint32_t b_1;
  uint32_t a_1;
  uint8_t texdata_1;
  int xmask;
  uint8_t xshift;
  uint8_t yshift;
  uint32_t b;
  uint32_t a;
  uint8_t texdata;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int spot;
  int count;
  uint8_t *colormap;
  uint8_t *source;
  uint8_t *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  DrawerThread *thread_local;
  DrawSpanMaskedAddClampPalCommand *this_local;
  
  bVar11 = DrawerThread::line_skipped_by_thread(thread,(this->super_PalSpanCommand)._y);
  if (!bVar11) {
    puVar7 = (this->super_PalSpanCommand)._source;
    puVar8 = (this->super_PalSpanCommand)._colormap;
    puVar9 = (this->super_PalSpanCommand)._srcblend;
    puVar10 = (this->super_PalSpanCommand)._destblend;
    xstep = (this->super_PalSpanCommand)._xfrac;
    ystep = (this->super_PalSpanCommand)._yfrac;
    source = (this->super_PalSpanCommand)._destorg +
             (*(int *)(ylookup + (long)(this->super_PalSpanCommand)._y * 4) +
             (this->super_PalSpanCommand)._x1);
    fg2rgb._4_4_ = ((this->super_PalSpanCommand)._x2 - (this->super_PalSpanCommand)._x1) + 1;
    dVar2 = (this->super_PalSpanCommand)._xstep;
    dVar3 = (this->super_PalSpanCommand)._ystep;
    if (((this->super_PalSpanCommand)._xbits == 6) && ((this->super_PalSpanCommand)._ybits == 6)) {
      do {
        bVar14 = puVar7[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))];
        if (bVar14 != 0) {
          uVar12 = puVar9[puVar8[bVar14]] + puVar10[*source];
          uVar13 = uVar12 & 0x40100400;
          uVar12 = uVar13 - (uVar13 >> 5) | uVar12 & 0x3fffffff | 0x1f07c1f;
          *source = RGB32k.All[uVar12 & uVar12 >> 0xf];
        }
        source = source + 1;
        xstep = dVar2 + xstep;
        ystep = dVar3 + ystep;
        fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
      } while (fg2rgb._4_4_ != 0);
    }
    else {
      bVar14 = 0x20 - (char)(this->super_PalSpanCommand)._ybits;
      iVar4 = (this->super_PalSpanCommand)._xbits;
      iVar5 = (this->super_PalSpanCommand)._xbits;
      iVar6 = (this->super_PalSpanCommand)._ybits;
      do {
        bVar1 = puVar7[(int)((xstep >> (bVar14 - (char)iVar4 & 0x1f) &
                             (1 << ((byte)iVar5 & 0x1f)) + -1 << ((byte)iVar6 & 0x1f)) +
                            (ystep >> (bVar14 & 0x1f)))];
        if (bVar1 != 0) {
          uVar12 = puVar9[puVar8[bVar1]] + puVar10[*source];
          uVar13 = uVar12 & 0x40100400;
          uVar12 = uVar13 - (uVar13 >> 5) | uVar12 & 0x3fffffff | 0x1f07c1f;
          *source = RGB32k.All[uVar12 & uVar12 >> 0xf];
        }
        source = source + 1;
        xstep = dVar2 + xstep;
        ystep = dVar3 + ystep;
        fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
      } while (fg2rgb._4_4_ != 0);
    }
  }
  return;
}

Assistant:

void DrawSpanMaskedAddClampPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				uint8_t texdata;

				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));
				texdata = source[spot];
				if (texdata != 0)
				{
					uint32_t a = fg2rgb[colormap[texdata]] + bg2rgb[*dest];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					*dest = RGB32k.All[a & (a >> 15)];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;
			do
			{
				uint8_t texdata;

				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
				texdata = source[spot];
				if (texdata != 0)
				{
					uint32_t a = fg2rgb[colormap[texdata]] + bg2rgb[*dest];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					*dest = RGB32k.All[a & (a >> 15)];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}